

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# url_parser.cpp
# Opt level: O0

int __thiscall coda_url::reset(coda_url *this)

{
  bool bVar1;
  coda_url *in_RDI;
  
  bVar1 = allocated(in_RDI);
  if (bVar1) {
    free(in_RDI->val_str);
  }
  in_RDI->dom_str = (char *)0x0;
  in_RDI->val_str = (char *)0x0;
  in_RDI->dom_len = 0;
  in_RDI->val_len = 0;
  return 0;
}

Assistant:

int coda_url::reset()
{
	if (allocated())
	{
		free(val_str);
	}

	val_str = dom_str = NULL;
	val_len = dom_len = 0;

	return 0;
}